

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O0

ObserveStatus __thiscall WFC::observe(WFC *this)

{
  bool bVar1;
  int iVar2;
  Propagator *this_00;
  const_reference pvVar3;
  long in_RDI;
  Wave *this_01;
  Wave *pWVar4;
  uint k_2;
  uint k_1;
  size_t chosen_value;
  double random_value;
  uniform_real_distribution<double> dis;
  uint k;
  double s;
  int argmin;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff68;
  Wave *in_stack_ffffffffffffff70;
  uint x;
  uint y;
  WFC *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa7;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  Wave *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  iVar2 = Wave::get_min_entropy
                    (in_stack_ffffffffffffffb8,
                     (minstd_rand *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar2 == -2) {
    local_4 = failure;
  }
  else if (iVar2 == -1) {
    wave_to_output(in_stack_ffffffffffffff98);
    Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)0x11436c);
    local_4 = success;
  }
  else {
    for (uVar5 = 0; (ulong)uVar5 < *(ulong *)(in_RDI + 0x118); uVar5 = uVar5 + 1) {
      bVar1 = Wave::get(in_stack_ffffffffffffff70,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (uint)in_stack_ffffffffffffff68);
      if (bVar1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(ulong)uVar5);
      }
    }
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)in_stack_ffffffffffffff70,
               (double)in_stack_ffffffffffffff68,5.59058499354725e-318);
    this_01 = (Wave *)std::uniform_real_distribution<double>::operator()
                                ((uniform_real_distribution<double> *)in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff68);
    this_00 = (Propagator *)(*(long *)(in_RDI + 0x118) - 1);
    pWVar4 = this_01;
    for (y = 0; (ulong)y < *(ulong *)(in_RDI + 0x118); y = y + 1) {
      bVar1 = Wave::get(this_01,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (uint)in_stack_ffffffffffffff68);
      if (bVar1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(ulong)y);
        in_stack_ffffffffffffff68 =
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)*pvVar3;
      }
      else {
        in_stack_ffffffffffffff68 =
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)0x0;
      }
      pWVar4 = (Wave *)((double)pWVar4 - (double)in_stack_ffffffffffffff68);
      if ((double)pWVar4 <= 0.0) {
        this_00 = (Propagator *)(ulong)y;
        break;
      }
    }
    for (x = 0; (ulong)x < *(ulong *)(in_RDI + 0x118); x = x + 1) {
      bVar1 = Wave::get(this_01,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (uint)in_stack_ffffffffffffff68);
      if (bVar1 != ((Propagator *)(ulong)x == this_00)) {
        Propagator::add_to_propagator(this_00,y,x,(uint)((ulong)in_RDI >> 0x20));
        Wave::set((Wave *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                  in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
      }
    }
    local_4 = to_continue;
  }
  return local_4;
}

Assistant:

WFC::ObserveStatus WFC::observe() noexcept {
    // Get the cell with lowest entropy.
    int argmin = wave.get_min_entropy(gen);

    // If there is a contradiction, the algorithm has failed.
    if (argmin == -2) {
      return failure;
    }

    // If the lowest entropy is 0, then the algorithm has succeeded and
    // finished.
    if (argmin == -1) {
      wave_to_output();
      return success;
    }

    // Choose an element according to the pattern distribution
    double s = 0;
    for (unsigned k = 0; k < nb_patterns; k++) {
      s += wave.get(argmin, k) ? patterns_frequencies[k] : 0;
    }

    std::uniform_real_distribution<> dis(0, s);
    double random_value = dis(gen);
    size_t chosen_value = nb_patterns - 1;

    for (unsigned k = 0; k < nb_patterns; k++) {
      random_value -= wave.get(argmin, k) ? patterns_frequencies[k] : 0;
      if (random_value <= 0) {
        chosen_value = k;
        break;
      }
    }

    // And define the cell with the pattern.
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(argmin, k) != (k == chosen_value)) {
        propagator.add_to_propagator(argmin / wave.width, argmin % wave.width,
                                     k);
        wave.set(argmin, k, false);
      }
    }

    return to_continue;
  }